

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1536,unsigned_long>
               (hashfunc<unsigned_long> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  reference pvVar3;
  size_type sVar4;
  byte in_CL;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  keytype k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  undefined4 in_stack_ffffffffffffff08;
  byte bVar6;
  undefined4 in_stack_ffffffffffffff0c;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  pfHash in_stack_ffffffffffffff20;
  uint8_t in_stack_ffffffffffffffbb;
  uint8_t in_stack_ffffffffffffffbc;
  uint8_t in_stack_ffffffffffffffbd;
  uint8_t in_stack_ffffffffffffffbe;
  uint8_t in_stack_ffffffffffffffbf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x600,pcVar5,(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14c20f);
  Blob<1536>::Blob((Blob<1536> *)&stack0xffffffffffffff18);
  memset(&stack0xffffffffffffff18,0,0xc0);
  if ((local_d & 1) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_28,0);
    (*p_Var2)(&stack0xffffffffffffff18,0xc0,0,pvVar3);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1536>,unsigned_long>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
             (bool)in_stack_ffffffffffffff17,
             (Blob<1536> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(in_ESI,in_EDX));
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar6 = 1;
  bVar1 = TestHashList<unsigned_long>
                    (in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf,
                     (bool)in_stack_ffffffffffffffbe,(bool)in_stack_ffffffffffffffbd,
                     (bool)in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb);
  bVar6 = bVar1 & bVar6;
  printf("\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}